

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexReader.cpp
# Opt level: O2

void __thiscall Ptex::v2_2::PtexReader::readLevel(PtexReader *this,int levelid,Level **level)

{
  pointer pLVar1;
  pointer pFVar2;
  Level *this_00;
  long lVar3;
  FaceDataHeader *pFVar4;
  bool bVar5;
  
  pthread_mutex_lock((pthread_mutex_t *)&this->readlock);
  if (*level == (Level *)0x0) {
    pLVar1 = (this->_levelinfo).
             super__Vector_base<Ptex::v2_2::LevelInfo,_std::allocator<Ptex::v2_2::LevelInfo>_>.
             _M_impl.super__Vector_impl_data._M_start;
    this_00 = (Level *)operator_new(0x48);
    Level::Level(this_00,pLVar1[levelid].nfaces);
    seek(this,(this->_levelpos).super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_start[levelid]);
    readZipBlock(this,(this_00->fdh).
                      super__Vector_base<Ptex::v2_2::FaceDataHeader,_std::allocator<Ptex::v2_2::FaceDataHeader>_>
                      ._M_impl.super__Vector_impl_data._M_start,pLVar1[levelid].levelheadersize,
                 pLVar1[levelid].nfaces << 2);
    computeOffsets(this,this->_pos,pLVar1[levelid].nfaces,
                   (this_00->fdh).
                   super__Vector_base<Ptex::v2_2::FaceDataHeader,_std::allocator<Ptex::v2_2::FaceDataHeader>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                   (this_00->offsets).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_start);
    if (levelid == 0) {
      pFVar2 = (this->_faceedits).
               super__Vector_base<Ptex::v2_2::PtexReader::FaceEdit,_std::allocator<Ptex::v2_2::PtexReader::FaceEdit>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar3 = (long)(this->_faceedits).
                    super__Vector_base<Ptex::v2_2::PtexReader::FaceEdit,_std::allocator<Ptex::v2_2::PtexReader::FaceEdit>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pFVar2 >> 4;
      pFVar4 = &pFVar2->fdh;
      while (bVar5 = lVar3 != 0, lVar3 = lVar3 + -1, bVar5) {
        (this_00->fdh).
        super__Vector_base<Ptex::v2_2::FaceDataHeader,_std::allocator<Ptex::v2_2::FaceDataHeader>_>.
        _M_impl.super__Vector_impl_data._M_start[*(int *)(pFVar4 + -1)].data = pFVar4->data;
        (this_00->offsets).super__Vector_base<long,_std::allocator<long>_>._M_impl.
        super__Vector_impl_data._M_start[*(int *)(pFVar4 + -1)] = ((FaceEdit *)(pFVar4 + -3))->pos;
        pFVar4 = pFVar4 + 4;
      }
    }
    *level = this_00;
    lVar3 = ((ulong)((long)(this_00->fdh).
                           super__Vector_base<Ptex::v2_2::FaceDataHeader,_std::allocator<Ptex::v2_2::FaceDataHeader>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this_00->fdh).
                          super__Vector_base<Ptex::v2_2::FaceDataHeader,_std::allocator<Ptex::v2_2::FaceDataHeader>_>
                          ._M_impl.super__Vector_impl_data._M_start) >> 2) * 0x14 + 0x48;
    if (lVar3 != 0) {
      LOCK();
      this->_memUsed = this->_memUsed + lVar3;
      UNLOCK();
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->readlock);
  return;
}

Assistant:

void PtexReader::readLevel(int levelid, Level*& level)
{
    // get read lock and make sure we still need to read
    AutoMutex locker(readlock);
    if (level) {
        return;
    }

    // go ahead and read the level
    LevelInfo& l = _levelinfo[levelid];

    // keep new level local until finished
    Level* newlevel = new Level(l.nfaces);
    seek(_levelpos[levelid]);
    readZipBlock(&newlevel->fdh[0], l.levelheadersize, FaceDataHeaderSize * l.nfaces);
    computeOffsets(tell(), l.nfaces, &newlevel->fdh[0], &newlevel->offsets[0]);

    // apply edits (if any) to level 0
    if (levelid == 0) {
        for (size_t i = 0, size = _faceedits.size(); i < size; i++) {
            FaceEdit& e = _faceedits[i];
            newlevel->fdh[e.faceid] = e.fdh;
            newlevel->offsets[e.faceid] = e.pos;
        }
    }

    // don't assign to result until level data is fully initialized
    AtomicStore(&level, newlevel);
    increaseMemUsed(level->memUsed());
}